

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_analyze.cpp
# Opt level: O0

void __thiscall
front::word::Word::Word(Word *this,Token in_token_value,string *in_self,uint in_line_num)

{
  undefined4 in_ECX;
  string *in_RDX;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 2));
  *in_RDI = in_ESI;
  std::__cxx11::string::operator=((string *)(in_RDI + 2),in_RDX);
  in_RDI[10] = in_ECX;
  return;
}

Assistant:

Word::Word(Token in_token_value, string in_self, unsigned int in_line_num) {
  token_value = in_token_value;
  self = in_self;
  line_num = in_line_num;
}